

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketLip.cpp
# Opt level: O0

void __thiscall UdpSocket::UdpSocket(UdpSocket *this)

{
  unique_ptr<UdpSocketImpl,_std::default_delete<UdpSocketImpl>_> local_18;
  UdpSocket *local_10;
  UdpSocket *this_local;
  
  local_10 = this;
  BaseSocket::BaseSocket(&this->super_BaseSocket);
  (this->super_BaseSocket)._vptr_BaseSocket = (_func_int **)&PTR__UdpSocket_001b89c8;
  std::make_unique<UdpSocketImpl,UdpSocket*>((UdpSocket **)&local_18);
  std::unique_ptr<BaseSocketImpl,std::default_delete<BaseSocketImpl>>::operator=
            ((unique_ptr<BaseSocketImpl,std::default_delete<BaseSocketImpl>> *)
             &(this->super_BaseSocket).Impl_,&local_18);
  std::unique_ptr<UdpSocketImpl,_std::default_delete<UdpSocketImpl>_>::~unique_ptr(&local_18);
  return;
}

Assistant:

UdpSocket::UdpSocket()
{
    Impl_ = make_unique<UdpSocketImpl>(this);
}